

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O2

void duckdb::Node15Leaf::ShrinkNode256Leaf(ART *art,Node *node15_leaf,Node *node256_leaf)

{
  byte bVar1;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *pBVar2;
  Node256Leaf *pNVar3;
  uint16_t i;
  ulong uVar4;
  ValidityMask mask;
  
  pBVar2 = BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::New(art,node15_leaf);
  pNVar3 = Node::Ref<duckdb::Node256Leaf>
                     (art,(Node)(node256_leaf->super_IndexPointer).data,NODE_256_LEAF);
  Node::SetGateStatus(node15_leaf,(GateStatus)((node256_leaf->super_IndexPointer).data >> 0x3f));
  mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = pNVar3->mask;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mask.super_TemplatedValidityMask<unsigned_long>.capacity = 0x100;
  bVar1 = pBVar2->count;
  for (uVar4 = 0; uVar4 != 0x100; uVar4 = uVar4 + 1) {
    if ((mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] >> (uVar4 & 0x3f)
        & 1) != 0) {
      pBVar2->key[bVar1] = (uint8_t)uVar4;
      bVar1 = bVar1 + 1;
      pBVar2->count = bVar1;
    }
  }
  Node::Free(art,node256_leaf);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void Node15Leaf::ShrinkNode256Leaf(ART &art, Node &node15_leaf, Node &node256_leaf) {
	auto &n15 = New(art, node15_leaf);
	auto &n256 = Node::Ref<Node256Leaf>(art, node256_leaf, NType::NODE_256_LEAF);
	node15_leaf.SetGateStatus(node256_leaf.GetGateStatus());

	ValidityMask mask(&n256.mask[0], Node256::CAPACITY);
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (mask.RowIsValid(i)) {
			n15.key[n15.count] = UnsafeNumericCast<uint8_t>(i);
			n15.count++;
		}
	}

	Node::Free(art, node256_leaf);
}